

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O0

void __thiscall duckdb::ColumnData::InitializeScan(ColumnData *this,ColumnScanState *state)

{
  ColumnSegment *pCVar1;
  long *in_RSI;
  long in_RDI;
  SegmentTree<duckdb::ColumnSegment,_false> *in_stack_00000010;
  pointer in_stack_ffffffffffffffd8;
  unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true> *this_00
  ;
  
  pCVar1 = SegmentTree<duckdb::ColumnSegment,_false>::GetRootSegment(in_stack_00000010);
  *in_RSI = (long)pCVar1;
  in_RSI[1] = in_RDI + 0x48;
  if (*in_RSI == 0) {
    this_00 = (unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
               *)0x0;
  }
  else {
    this_00 = *(unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
                **)*in_RSI;
  }
  in_RSI[2] = (long)this_00;
  in_RSI[3] = in_RSI[2];
  *(undefined1 *)(in_RSI + 8) = 0;
  unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>::reset
            (this_00,in_stack_ffffffffffffffd8);
  in_RSI[0xc] = 0;
  return;
}

Assistant:

void ColumnData::InitializeScan(ColumnScanState &state) {
	state.current = data.GetRootSegment();
	state.segment_tree = &data;
	state.row_index = state.current ? state.current->start : 0;
	state.internal_index = state.row_index;
	state.initialized = false;
	state.scan_state.reset();
	state.last_offset = 0;
}